

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ontrak.h
# Opt level: O2

int SetDigitalRelayOntrak(ONTRAK *pOntrak,int channel,int bOpen)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  int relay_state;
  char sendbuf [64];
  char recvbuf [64];
  
  relay_state = 0;
  sendbuf[0] = '\0';
  sendbuf[1] = '\0';
  sendbuf[2] = '\0';
  sendbuf[3] = '\0';
  sendbuf[4] = '\0';
  sendbuf[5] = '\0';
  sendbuf[6] = '\0';
  sendbuf[7] = '\0';
  sendbuf[8] = '\0';
  sendbuf[9] = '\0';
  sendbuf[10] = '\0';
  sendbuf[0xb] = '\0';
  sendbuf[0xc] = '\0';
  sendbuf[0xd] = '\0';
  sendbuf[0xe] = '\0';
  sendbuf[0xf] = '\0';
  sendbuf[0x10] = '\0';
  sendbuf[0x11] = '\0';
  sendbuf[0x12] = '\0';
  sendbuf[0x13] = '\0';
  sendbuf[0x14] = '\0';
  sendbuf[0x15] = '\0';
  sendbuf[0x16] = '\0';
  sendbuf[0x17] = '\0';
  sendbuf[0x18] = '\0';
  sendbuf[0x19] = '\0';
  sendbuf[0x1a] = '\0';
  sendbuf[0x1b] = '\0';
  sendbuf[0x1c] = '\0';
  sendbuf[0x1d] = '\0';
  sendbuf[0x1e] = '\0';
  sendbuf[0x1f] = '\0';
  sendbuf[0x20] = '\0';
  sendbuf[0x21] = '\0';
  sendbuf[0x22] = '\0';
  sendbuf[0x23] = '\0';
  sendbuf[0x24] = '\0';
  sendbuf[0x25] = '\0';
  sendbuf[0x26] = '\0';
  sendbuf[0x27] = '\0';
  sendbuf[0x28] = '\0';
  sendbuf[0x29] = '\0';
  sendbuf[0x2a] = '\0';
  sendbuf[0x2b] = '\0';
  sendbuf[0x2c] = '\0';
  sendbuf[0x2d] = '\0';
  sendbuf[0x2e] = '\0';
  sendbuf[0x2f] = '\0';
  sendbuf[0x30] = '\0';
  sendbuf[0x31] = '\0';
  sendbuf[0x32] = '\0';
  sendbuf[0x33] = '\0';
  sendbuf[0x34] = '\0';
  sendbuf[0x35] = '\0';
  sendbuf[0x36] = '\0';
  sendbuf[0x37] = '\0';
  sendbuf[0x38] = '\0';
  sendbuf[0x39] = '\0';
  sendbuf[0x3a] = '\0';
  sendbuf[0x3b] = '\0';
  sendbuf[0x3c] = '\0';
  sendbuf[0x3d] = '\0';
  sendbuf[0x3e] = '\0';
  sendbuf[0x3f] = '\0';
  pcVar4 = "0RESPA%d\r";
  if (bOpen == 0) {
    pcVar4 = "0SETPA%d\r";
  }
  sprintf(sendbuf,pcVar4,channel);
  sVar3 = strlen(sendbuf);
  iVar1 = WriteDataOntrak(pOntrak,(uint8 *)sendbuf,(int)sVar3,pOntrak->bytedelayus);
  iVar2 = 1;
  pcVar4 = "Error writing data to a Ontrak. ";
  if (iVar1 == 0) {
    if ((pOntrak->bSaveRawData != 0) && ((FILE *)pOntrak->pfSaveFile != (FILE *)0x0)) {
      fwrite(sendbuf,(long)(int)sVar3,1,(FILE *)pOntrak->pfSaveFile);
      fflush((FILE *)pOntrak->pfSaveFile);
    }
    mSleep(0x19);
    if (pOntrak->bCheckState == 0) {
      return 0;
    }
    sendbuf[0x30] = '\0';
    sendbuf[0x31] = '\0';
    sendbuf[0x32] = '\0';
    sendbuf[0x33] = '\0';
    sendbuf[0x34] = '\0';
    sendbuf[0x35] = '\0';
    sendbuf[0x36] = '\0';
    sendbuf[0x37] = '\0';
    sendbuf[0x38] = '\0';
    sendbuf[0x39] = '\0';
    sendbuf[0x3a] = '\0';
    sendbuf[0x3b] = '\0';
    sendbuf[0x3c] = '\0';
    sendbuf[0x3d] = '\0';
    sendbuf[0x3e] = '\0';
    sendbuf[0x3f] = '\0';
    sendbuf[0x20] = '\0';
    sendbuf[0x21] = '\0';
    sendbuf[0x22] = '\0';
    sendbuf[0x23] = '\0';
    sendbuf[0x24] = '\0';
    sendbuf[0x25] = '\0';
    sendbuf[0x26] = '\0';
    sendbuf[0x27] = '\0';
    sendbuf[0x28] = '\0';
    sendbuf[0x29] = '\0';
    sendbuf[0x2a] = '\0';
    sendbuf[0x2b] = '\0';
    sendbuf[0x2c] = '\0';
    sendbuf[0x2d] = '\0';
    sendbuf[0x2e] = '\0';
    sendbuf[0x2f] = '\0';
    sendbuf[0x10] = '\0';
    sendbuf[0x11] = '\0';
    sendbuf[0x12] = '\0';
    sendbuf[0x13] = '\0';
    sendbuf[0x14] = '\0';
    sendbuf[0x15] = '\0';
    sendbuf[0x16] = '\0';
    sendbuf[0x17] = '\0';
    sendbuf[0x18] = '\0';
    sendbuf[0x19] = '\0';
    sendbuf[0x1a] = '\0';
    sendbuf[0x1b] = '\0';
    sendbuf[0x1c] = '\0';
    sendbuf[0x1d] = '\0';
    sendbuf[0x1e] = '\0';
    sendbuf[0x1f] = '\0';
    sendbuf[0] = '\0';
    sendbuf[1] = '\0';
    sendbuf[2] = '\0';
    sendbuf[3] = '\0';
    sendbuf[4] = '\0';
    sendbuf[5] = '\0';
    sendbuf[6] = '\0';
    sendbuf[7] = '\0';
    sendbuf[8] = '\0';
    sendbuf[9] = '\0';
    sendbuf[10] = '\0';
    sendbuf[0xb] = '\0';
    sendbuf[0xc] = '\0';
    sendbuf[0xd] = '\0';
    sendbuf[0xe] = '\0';
    sendbuf[0xf] = '\0';
    sprintf(sendbuf,"0RPA%d\r",channel);
    sVar3 = strlen(sendbuf);
    iVar2 = WriteDataOntrak(pOntrak,(uint8 *)sendbuf,(int)sVar3,pOntrak->bytedelayus);
    if (iVar2 == 0) {
      iVar2 = 1;
      if ((pOntrak->bSaveRawData != 0) && ((FILE *)pOntrak->pfSaveFile != (FILE *)0x0)) {
        fwrite(sendbuf,(long)(int)sVar3,1,(FILE *)pOntrak->pfSaveFile);
        fflush((FILE *)pOntrak->pfSaveFile);
      }
      recvbuf[0x30] = '\0';
      recvbuf[0x31] = '\0';
      recvbuf[0x32] = '\0';
      recvbuf[0x33] = '\0';
      recvbuf[0x34] = '\0';
      recvbuf[0x35] = '\0';
      recvbuf[0x36] = '\0';
      recvbuf[0x37] = '\0';
      recvbuf[0x38] = '\0';
      recvbuf[0x39] = '\0';
      recvbuf[0x3a] = '\0';
      recvbuf[0x3b] = '\0';
      recvbuf[0x3c] = '\0';
      recvbuf[0x3d] = '\0';
      recvbuf[0x3e] = '\0';
      recvbuf[0x3f] = '\0';
      recvbuf[0x20] = '\0';
      recvbuf[0x21] = '\0';
      recvbuf[0x22] = '\0';
      recvbuf[0x23] = '\0';
      recvbuf[0x24] = '\0';
      recvbuf[0x25] = '\0';
      recvbuf[0x26] = '\0';
      recvbuf[0x27] = '\0';
      recvbuf[0x28] = '\0';
      recvbuf[0x29] = '\0';
      recvbuf[0x2a] = '\0';
      recvbuf[0x2b] = '\0';
      recvbuf[0x2c] = '\0';
      recvbuf[0x2d] = '\0';
      recvbuf[0x2e] = '\0';
      recvbuf[0x2f] = '\0';
      recvbuf[0x10] = '\0';
      recvbuf[0x11] = '\0';
      recvbuf[0x12] = '\0';
      recvbuf[0x13] = '\0';
      recvbuf[0x14] = '\0';
      recvbuf[0x15] = '\0';
      recvbuf[0x16] = '\0';
      recvbuf[0x17] = '\0';
      recvbuf[0x18] = '\0';
      recvbuf[0x19] = '\0';
      recvbuf[0x1a] = '\0';
      recvbuf[0x1b] = '\0';
      recvbuf[0x1c] = '\0';
      recvbuf[0x1d] = '\0';
      recvbuf[0x1e] = '\0';
      recvbuf[0x1f] = '\0';
      recvbuf[0] = '\0';
      recvbuf[1] = '\0';
      recvbuf[2] = '\0';
      recvbuf[3] = '\0';
      recvbuf[4] = '\0';
      recvbuf[5] = '\0';
      recvbuf[6] = '\0';
      recvbuf[7] = '\0';
      recvbuf[8] = '\0';
      recvbuf[9] = '\0';
      recvbuf[10] = '\0';
      recvbuf[0xb] = '\0';
      recvbuf[0xc] = '\0';
      recvbuf[0xd] = '\0';
      recvbuf[0xe] = '\0';
      recvbuf[0xf] = '\0';
      iVar1 = ReadAllRS232Port(&pOntrak->RS232Port,(uint8 *)recvbuf,2);
      if (iVar1 == 0) {
        if ((pOntrak->bSaveRawData != 0) && ((FILE *)pOntrak->pfSaveFile != (FILE *)0x0)) {
          fwrite(recvbuf,2,1,(FILE *)pOntrak->pfSaveFile);
          fflush((FILE *)pOntrak->pfSaveFile);
        }
        iVar1 = __isoc99_sscanf(recvbuf,"%d",&relay_state);
        if (iVar1 == 1) {
          pcVar4 = "Error reading data from a Ontrak : Inconsitent digital relay state. ";
          if ((relay_state != 1 || bOpen != 1) && (bOpen != 0 || relay_state != 0)) {
            return 0;
          }
        }
        else {
          iVar2 = 4;
          pcVar4 = "Error reading data from a Ontrak : Invalid data. ";
        }
      }
      else {
        pcVar4 = "Error reading data from a Ontrak. ";
      }
    }
    else {
      iVar2 = 1;
    }
  }
  puts(pcVar4);
  return iVar2;
}

Assistant:

inline int SetDigitalRelayOntrak(ONTRAK* pOntrak, int channel, int bOpen)
{
	char sendbuf[MAX_NB_BYTES_ONTRAK];
	int sendbuflen = 0;
	char recvbuf[MAX_NB_BYTES_ONTRAK];
	int recvbuflen = 0;
	int relay_state = 0;

	// Prepare data to send to device.
	memset(sendbuf, 0, sizeof(sendbuf));
	if (bOpen)
	{
		sprintf(sendbuf, "0RESPA%d\r", channel);
	}
	else
	{
		sprintf(sendbuf, "0SETPA%d\r", channel);
	}
	sendbuflen = (int)strlen(sendbuf);

	if (WriteDataOntrak(pOntrak, (unsigned char*)sendbuf, sendbuflen, pOntrak->bytedelayus) != EXIT_SUCCESS)
	{
		printf("Error writing data to a Ontrak. \n");
		return EXIT_FAILURE;
	}
	if ((pOntrak->bSaveRawData)&&(pOntrak->pfSaveFile))
	{
		fwrite(sendbuf, sendbuflen, 1, pOntrak->pfSaveFile);
		fflush(pOntrak->pfSaveFile);
	}

	mSleep(25);

	if (pOntrak->bCheckState)
	{
		// Check state : 0RPA%d\r returns 0 if reset or 1 if set.

		// Prepare data to send to device.
		memset(sendbuf, 0, sizeof(sendbuf));
		sprintf(sendbuf, "0RPA%d\r", channel);
		sendbuflen = (int)strlen(sendbuf);

		if (WriteDataOntrak(pOntrak, (unsigned char*)sendbuf, sendbuflen, pOntrak->bytedelayus) != EXIT_SUCCESS)
		{
			printf("Error writing data to a Ontrak. \n");
			return EXIT_FAILURE;
		}
		if ((pOntrak->bSaveRawData)&&(pOntrak->pfSaveFile))
		{
			fwrite(sendbuf, sendbuflen, 1, pOntrak->pfSaveFile);
			fflush(pOntrak->pfSaveFile);
		}

		// Prepare the buffer that should receive data from the device.
		memset(recvbuf, 0, sizeof(recvbuf));
		recvbuflen = 2; // The last character must be a 0 to be a valid string for sscanf.

		if (ReadAllRS232Port(&pOntrak->RS232Port, (unsigned char*)recvbuf, recvbuflen) != EXIT_SUCCESS)
		{
			printf("Error reading data from a Ontrak. \n");
			return EXIT_FAILURE;
		}
		if ((pOntrak->bSaveRawData)&&(pOntrak->pfSaveFile))
		{
			fwrite(recvbuf, recvbuflen, 1, pOntrak->pfSaveFile);
			fflush(pOntrak->pfSaveFile);
		}

		// Display and analyze received data.
		//printf("Received : \"%s\"\n", recvbuf);
		if (sscanf(recvbuf, "%d", &relay_state) != 1)
		{
			printf("Error reading data from a Ontrak : Invalid data. \n");
			return EXIT_INVALID_DATA;
		}

		if (((bOpen == 1)&&(relay_state == 1))||((bOpen == 0)&&(relay_state == 0)))
		{
			printf("Error reading data from a Ontrak : Inconsitent digital relay state. \n");
			return EXIT_FAILURE;
		}
	}

	return EXIT_SUCCESS;
}